

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# level_mesh.cxx
# Opt level: O2

void __thiscall
level_mesh::merge_orphans
          (level_mesh *this,b_submesh_vec *orphans,size_t num_groups,bool consider_gamemtl)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  pointer ppbVar4;
  b_submesh *this_00;
  pointer pbVar5;
  pointer p_Var6;
  pointer pbVar7;
  _vector3<float> *this_01;
  reference ppbVar8;
  uint uVar9;
  pointer ppbVar10;
  pointer pbVar11;
  size_type __n;
  float fVar12;
  float fVar13;
  float local_a0;
  anon_union_12_2_77b31271_for__vector3<float>_1 local_58;
  fvector3 p;
  
  ppbVar10 = (orphans->super__Vector_base<b_submesh_*,_std::allocator<b_submesh_*>_>)._M_impl.
             super__Vector_impl_data._M_start;
  ppbVar4 = (orphans->super__Vector_base<b_submesh_*,_std::allocator<b_submesh_*>_>)._M_impl.
            super__Vector_impl_data._M_finish;
  if (ppbVar10 != ppbVar4) {
    xray_re::msg("merging %Iu orphan(s)",(long)ppbVar4 - (long)ppbVar10 >> 3);
    uVar1 = this->m_free_tag;
    ppbVar10 = (orphans->super__Vector_base<b_submesh_*,_std::allocator<b_submesh_*>_>)._M_impl.
               super__Vector_impl_data._M_start;
    ppbVar4 = (orphans->super__Vector_base<b_submesh_*,_std::allocator<b_submesh_*>_>)._M_impl.
              super__Vector_impl_data._M_finish;
    while (ppbVar10 != ppbVar4) {
      this_00 = *ppbVar10;
      uVar2 = (this_00->super_b_model_instance).min_face;
      pbVar5 = (this->super_xr_mesh_builder).m_faces.
               super__Vector_base<xray_re::xr_mesh_builder::b_face,_std::allocator<xray_re::xr_mesh_builder::b_face>_>
               ._M_impl.super__Vector_impl_data._M_start;
      p_Var6 = (this->super_xr_mesh_builder).super_xr_mesh.m_points.
               super__Vector_base<xray_re::_vector3<float>,_std::allocator<xray_re::_vector3<float>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      xray_re::_vector3<float>::calc_center
                (&p,p_Var6 + pbVar5[uVar2].field_0.field_0.v[0],
                 p_Var6 + pbVar5[uVar2].field_0.field_0.v[1],
                 p_Var6 + pbVar5[uVar2].field_0.field_0.v[2]);
      pbVar11 = (this->super_xr_mesh_builder).m_faces.
                super__Vector_base<xray_re::xr_mesh_builder::b_face,_std::allocator<xray_re::xr_mesh_builder::b_face>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pbVar7 = (this->super_xr_mesh_builder).m_faces.
               super__Vector_base<xray_re::xr_mesh_builder::b_face,_std::allocator<xray_re::xr_mesh_builder::b_face>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      uVar9 = 0xffffffff;
      fVar13 = 3.4028235e+38;
      local_a0 = 3.4028235e+38;
      __n = 0xffffffff;
      for (; pbVar11 != pbVar7; pbVar11 = pbVar11 + 1) {
        if (((pbVar11 != pbVar5 + uVar2) && (uVar3 = pbVar11->tag, uVar1 <= uVar3)) &&
           (uVar3 <= (uVar1 + (int)num_groups) - 1)) {
          local_58.field_0.z = 0.0;
          local_58._0_8_ = 0;
          p_Var6 = (this->super_xr_mesh_builder).super_xr_mesh.m_points.
                   super__Vector_base<xray_re::_vector3<float>,_std::allocator<xray_re::_vector3<float>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          this_01 = xray_re::_vector3<float>::calc_center
                              ((_vector3<float> *)&local_58.field_0,
                               p_Var6 + (pbVar11->field_0).field_0.v[0],
                               p_Var6 + (pbVar11->field_0).field_0.v[1],
                               p_Var6 + (pbVar11->field_0).field_0.v[2]);
          fVar12 = xray_re::_vector3<float>::distance(this_01,&p);
          if (fVar12 < fVar13) {
            __n = (size_type)uVar3;
            fVar13 = fVar12;
          }
          if (((consider_gamemtl) && (fVar12 < local_a0)) &&
             (*(short *)((long)&pbVar11->field_1 + 4) ==
              *(short *)((long)&pbVar5[uVar2].field_1 + 4))) {
            uVar9 = uVar3;
            local_a0 = fVar12;
          }
        }
      }
      ppbVar10 = ppbVar10 + 1;
      if (consider_gamemtl && uVar9 != 0xffffffff) {
        __n = (size_type)uVar9;
        fVar13 = local_a0;
      }
      local_a0 = fVar13;
      xray_re::msg("nearest: %u (%.2f)",SUB84((double)local_a0,0),__n);
      ppbVar8 = std::vector<b_model_instance_*,_std::allocator<b_model_instance_*>_>::at
                          (&this->m_instances,__n);
      merge(this,*ppbVar8,&this_00->super_b_model_instance);
      if (this_00 != (b_submesh *)0x0) {
        b_submesh::~b_submesh(this_00);
      }
      operator_delete(this_00,0xe0);
    }
    p.field_0._0_8_ =
         (orphans->super__Vector_base<b_submesh_*,_std::allocator<b_submesh_*>_>)._M_impl.
         super__Vector_impl_data._M_start;
    unique0x10000185 =
         (orphans->super__Vector_base<b_submesh_*,_std::allocator<b_submesh_*>_>)._M_impl.
         super__Vector_impl_data._M_finish;
    (orphans->super__Vector_base<b_submesh_*,_std::allocator<b_submesh_*>_>)._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (orphans->super__Vector_base<b_submesh_*,_std::allocator<b_submesh_*>_>)._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (orphans->super__Vector_base<b_submesh_*,_std::allocator<b_submesh_*>_>)._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::_Vector_base<b_submesh_*,_std::allocator<b_submesh_*>_>::~_Vector_base
              ((_Vector_base<b_submesh_*,_std::allocator<b_submesh_*>_> *)&p);
  }
  return;
}

Assistant:

void level_mesh::merge_orphans(b_submesh_vec& orphans, size_t num_groups, bool consider_gamemtl)
{
	if (orphans.empty())
		return;
	msg("merging %" PRIuSIZET " orphan(s)", orphans.size());
	uint32_t min_tag = m_free_tag, max_tag = min_tag + uint32_t(num_groups & UINT32_MAX) - 1;
	for (b_submesh_vec_it it = orphans.begin(), end = orphans.end(); it != end;) {
		b_submesh* sm = *it++;
		const b_face* face = &m_faces[sm->min_face];
		fvector3 p;
		p.calc_center(m_points[face->v0], m_points[face->v1], m_points[face->v2]);
		uint32_t tag1 = BAD_IDX, tag2 = tag1;
		float min_dist1 = xr_numeric_limits<float>::max(), min_dist2 = min_dist1;
		for (b_face_vec_it it1 = m_faces.begin(), end1 = m_faces.end(); it1 != end1; ++it1) {
			uint32_t tag;
			if ((tag = it1->tag) >= min_tag && tag <= max_tag && face != &*it1) {
				float dist = fvector3().calc_center(m_points[it1->v0], m_points[it1->v1], m_points[it1->v2]).distance(p);
				if (min_dist1 > dist) {
					min_dist1 = dist;
					tag1 = tag;
				}
				if (consider_gamemtl && min_dist2 > dist &&
						it1->surface.gamemtl == face->surface.gamemtl) {
					min_dist2 = dist;
					tag2 = tag;
				}
			}
		}
		if (consider_gamemtl && tag2 != BAD_IDX) {
			tag1 = tag2;
			min_dist1 = min_dist2;
		}
		msg("nearest: %" PRIu32 " (%.2f)", tag1, min_dist1);
		merge(m_instances.at(tag1), sm);
		delete sm;
	}
	b_submesh_vec().swap(orphans);
}